

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::HandleInput(BoardView *this)

{
  KeyBindings *this_00;
  bool *pbVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  EBoardSide EVar5;
  long *plVar6;
  long lVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  element_type *peVar9;
  shared_ptr<Component> *psVar10;
  ImVec2 IVar11;
  undefined1 auVar12 [16];
  undefined8 uVar13;
  bool bVar14;
  undefined4 extraout_EAX;
  ImGuiIO *pIVar15;
  Board *pBVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar17;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  _Var18;
  undefined4 extraout_var_02;
  undefined8 extraout_RAX;
  undefined4 extraout_var_03;
  shared_ptr<Component> *part_1;
  BRDFileBase *pBVar19;
  long *plVar20;
  byte bVar21;
  long lVar22;
  uint8_t uVar23;
  element_type *peVar24;
  BoardView *this_01;
  shared_ptr<Pin> *pin;
  shared_ptr<Component> *psVar25;
  SharedVector<Component> *this_02;
  shared_ptr<Component> *part;
  shared_ptr<Component> *__x;
  int iVar26;
  int iVar27;
  float fVar28;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar29;
  array<ImVec2,_4UL> poly;
  shared_ptr<Pin> selection;
  undefined1 local_b8 [4];
  float fStack_b4;
  ImVec2 IStack_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  ulong local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [8];
  undefined4 uStack_70;
  undefined4 uStack_6c;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  SharedVector<Pin> *local_50;
  SharedVector<Component> *local_48;
  shared_ptr<Component> *local_40;
  shared_ptr<Component> *local_38;
  
  if (this->m_board == (Board *)0x0) {
    return;
  }
  if (this->m_file == (BRDFileBase *)0x0) {
    return;
  }
  pIVar15 = ImGui::GetIO();
  bVar14 = ImGui::IsWindowHovered(0);
  if (bVar14) {
    bVar14 = ImGui::IsWindowFocused(0);
    if (!bVar14) {
      ImGui::FocusWindow((ImGuiWindow *)0x0,2);
    }
    bVar14 = ImGui::IsMouseDragging(0,-1.0);
    iVar26 = this->m_dragging_token;
    if (bVar14) {
      if (iVar26 != 1) {
        if ((iVar26 != 0) ||
           (fVar29 = (this->m_board_surface).x,
           fVar29 < pIVar15->MouseClickedPos[0].x || fVar29 == pIVar15->MouseClickedPos[0].x))
        goto LAB_00118f6b;
        this->m_dragging_token = 1;
      }
      IVar11 = ImGui::GetMouseDragDelta(0,-1.0);
      iVar26 = -(uint)(500.0 < ABS(IVar11.x));
      iVar27 = -(uint)(500.0 < ABS(IVar11.y));
      auVar12._4_4_ = iVar26;
      auVar12._0_4_ = iVar26;
      auVar12._8_4_ = iVar27;
      auVar12._12_4_ = iVar27;
      iVar26 = movmskpd(extraout_EAX,auVar12);
      uStack_70 = 0;
      uStack_6c = 0;
      local_78._0_4_ = 0.0;
      local_78._4_4_ = 0.0;
      if (iVar26 == 0) {
        local_78._0_4_ = IVar11.x;
        local_78._4_4_ = IVar11.y;
        uStack_70 = extraout_XMM0_Dc;
        uStack_6c = extraout_XMM0_Dd;
      }
      ImGui::ResetMouseDragDelta(0);
      IVar11 = ScreenToCoord(this,(float)local_78._0_4_,(float)local_78._4_4_,0.0);
      uVar3 = this->m_dx;
      uVar4 = this->m_dy;
      this->m_dx = (float)uVar3 + IVar11.x;
      this->m_dy = (float)uVar4 + IVar11.y;
      this->m_needsRedraw = true;
      this->m_draggingLastFrame = true;
    }
    else if (-1 < iVar26) {
      this->m_dragging_token = 0;
      if (this->m_lastFileOpenWasInvalid == false) {
        pBVar19 = this->m_file;
        pBVar16 = this->m_board;
        if (pBVar16 == (Board *)0x0 || pBVar19 == (BRDFileBase *)0x0) {
          bVar21 = 0;
LAB_001189f3:
          if (pBVar16 != (Board *)0x0 && (pBVar19 != (BRDFileBase *)0x0 && (bVar21 & 1) == 0)) {
            bVar14 = ImGui::IsMouseReleased(2);
            if (bVar14) {
              FlipBoard(this,0);
              goto LAB_00118f2f;
            }
            bVar21 = this->m_lastFileOpenWasInvalid;
            pBVar19 = this->m_file;
            pBVar16 = this->m_board;
          }
          if (((((bVar21 & 1) == 0) && (pBVar19 != (BRDFileBase *)0x0)) && (pBVar16 != (Board *)0x0)
              ) && ((bVar14 = ImGui::IsMouseReleased(0), bVar14 &&
                    (this->m_draggingLastFrame == false)))) {
            IVar11 = ImGui::GetMousePos();
            IVar11 = ScreenToCoord(this,IVar11.x,IVar11.y,1.0);
            local_88._8_4_ = extraout_XMM0_Dc_01;
            local_88._0_4_ = IVar11.x;
            local_88._4_4_ = IVar11.y;
            local_88._12_4_ = extraout_XMM0_Dd_01;
            this->m_needsRedraw = true;
            iVar26 = this->m_pinDiameter;
            local_68 = (element_type *)0x0;
            a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            iVar27 = (*this->m_board->_vptr_Board[4])();
            plVar20 = *(long **)CONCAT44(extraout_var,iVar27);
            plVar6 = (long *)((long *)CONCAT44(extraout_var,iVar27))[1];
            local_78._4_4_ = local_88._4_4_;
            local_78._0_4_ = local_88._4_4_;
            uStack_70 = local_88._4_4_;
            uStack_6c = local_88._4_4_;
            if (plVar20 != plVar6) {
              fVar29 = (float)iVar26 * 0.5;
              local_90 = CONCAT44(local_90._4_4_,fVar29 * fVar29);
              fVar29 = (float)local_88._0_4_;
              do {
                lVar7 = *plVar20;
                p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar20[1];
                if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                  }
                }
                if (lVar7 == 0) {
                  bVar14 = true;
                }
                else {
                  iVar26 = *(int *)(lVar7 + 8);
                  bVar14 = iVar26 == 2 || iVar26 == this->m_current_side;
                }
                if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                  fVar29 = (float)local_88._0_4_;
                }
                if (bVar14) {
                  peVar24 = (element_type *)*plVar20;
                  fVar29 = (peVar24->position).x - fVar29;
                  fVar28 = (peVar24->position).y - (float)local_78._0_4_;
                  fVar28 = fVar29 * fVar29 + fVar28 * fVar28;
                  if (fVar28 < peVar24->diameter * peVar24->diameter) {
                    fVar29 = (float)local_88._0_4_;
                    if ((float)local_90 <= fVar28) goto LAB_00118bd2;
                    local_90 = CONCAT44(local_90._4_4_,fVar28);
                    local_68 = peVar24;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                              (a_Stack_60,
                               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar20 + 1));
                  }
                  fVar29 = (float)local_88._0_4_;
                }
LAB_00118bd2:
                plVar20 = plVar20 + 2;
              } while (plVar20 != plVar6);
            }
            (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 local_68;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,a_Stack_60);
            peVar24 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            if (peVar24 == (element_type *)0x0) {
LAB_00118cb8:
              iVar26 = (*this->m_board->_vptr_Board[3])();
              __x = *(shared_ptr<Component> **)CONCAT44(extraout_var_01,iVar26);
              psVar25 = (shared_ptr<Component> *)((long *)CONCAT44(extraout_var_01,iVar26))[1];
              if (__x != psVar25) {
                this_02 = &this->m_partHighlighted;
                local_50 = &this->m_pinHighlighted;
                local_90 = 0;
                local_48 = this_02;
                local_40 = psVar25;
                do {
                  peVar9 = (__x->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                  p_Var8 = (__x->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
                           _M_refcount._M_pi;
                  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                    }
                  }
                  if (peVar9 == (element_type *)0x0) {
                    bVar14 = true;
                  }
                  else {
                    EVar5 = (peVar9->super_BoardElement).board_side;
                    bVar14 = EVar5 == kBoardSideBoth || EVar5 == this->m_current_side;
                  }
                  if (p_Var8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                  }
                  if (bVar14) {
                    peVar9 = (__x->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    ;
                    IVar11 = (peVar9->outline)._M_elems[3];
                    local_a8._M_allocated_capacity._0_4_ = (peVar9->outline)._M_elems[2].x;
                    local_a8._M_allocated_capacity._4_4_ = (peVar9->outline)._M_elems[2].y;
                    local_a8._8_4_ = IVar11.x;
                    local_a8._12_4_ = IVar11.y;
                    uVar13 = local_a8._8_8_;
                    _local_b8 = (peVar9->outline)._M_elems[0];
                    IStack_b0 = (peVar9->outline)._M_elems[1];
                    local_a8._12_4_ = IVar11.y;
                    bVar14 = false;
                    lVar7 = 0;
                    lVar22 = 3;
                    do {
                      lVar17 = lVar7;
                      fVar29 = *(float *)(local_b8 + lVar17 * 8 + 4);
                      if (((float)local_78._0_4_ < fVar29 ==
                           (float)local_a8._12_4_ <= (float)local_78._0_4_) &&
                         ((float)local_88._0_4_ <
                          (((float)local_78._0_4_ - fVar29) *
                          (*(float *)(local_b8 + lVar22 * 8) - *(float *)(local_b8 + lVar17 * 8))) /
                          ((float)local_a8._12_4_ - fVar29) + *(float *)(local_b8 + lVar17 * 8))) {
                        bVar14 = (bool)(bVar14 ^ 1);
                      }
                      lVar7 = lVar17 + 1;
                      lVar22 = lVar17;
                      local_a8._12_4_ = fVar29;
                    } while (lVar17 + 1 != 4);
                    local_a8._8_8_ = uVar13;
                    if (bVar14) {
                      _Var18 = std::
                               __find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<Component>const>>
                                         ((this->m_partHighlighted).
                                          super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (this->m_partHighlighted).
                                          super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish,__x);
                      psVar10 = (this->m_partHighlighted).
                                super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                      if (pIVar15->KeyCtrl == true) {
                        if (_Var18._M_current == psVar10) {
LAB_00118eb1:
                          uVar23 = '\x01';
                          std::
                          vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                          ::push_back(this_02,__x);
                        }
                        else {
                          remove<std::shared_ptr<Component>>(__x,this_02);
                          uVar23 = '\0';
                        }
                        peVar9 = (__x->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr;
                        peVar9->visualmode = uVar23;
                        local_90 = CONCAT71((int7)((ulong)peVar9 >> 8),1);
                      }
                      else {
                        local_38 = psVar10;
                        iVar26 = (*this->m_board->_vptr_Board[3])();
                        plVar6 = (long *)((undefined8 *)CONCAT44(extraout_var_02,iVar26))[1];
                        for (plVar20 = *(long **)CONCAT44(extraout_var_02,iVar26);
                            this_02 = local_48, plVar20 != plVar6; plVar20 = plVar20 + 2) {
                          lVar7 = *plVar20;
                          p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar20[1];
                          if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                            *(undefined1 *)(lVar7 + 0xe0) = 0;
                          }
                          else {
                            if (__libc_single_threaded == '\0') {
                              LOCK();
                              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                              UNLOCK();
                            }
                            else {
                              p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                            }
                            *(undefined1 *)(lVar7 + 0xe0) = 0;
                            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                          }
                        }
                        std::
                        vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                        ::resize(local_48,0);
                        psVar25 = local_40;
                        std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::
                        resize(local_50,0);
                        local_90 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                        if (_Var18._M_current == local_38) goto LAB_00118eb1;
                      }
                    }
                  }
                  __x = __x + 1;
                } while (__x != psVar25);
                if ((local_90 & 1) != 0) goto LAB_00118f20;
              }
              if (pIVar15->KeyCtrl == false) {
                iVar26 = (*this->m_board->_vptr_Board[3])();
                plVar6 = (long *)((undefined8 *)CONCAT44(extraout_var_03,iVar26))[1];
                for (plVar20 = *(long **)CONCAT44(extraout_var_03,iVar26); plVar20 != plVar6;
                    plVar20 = plVar20 + 2) {
                  *(undefined1 *)(*plVar20 + 0xe0) = 0;
                }
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                clear(&this->m_partHighlighted);
              }
            }
            else {
              if (pIVar15->KeyCtrl == false) {
                iVar26 = (*this->m_board->_vptr_Board[3])();
                plVar6 = (long *)((undefined8 *)CONCAT44(extraout_var_00,iVar26))[1];
                for (plVar20 = *(long **)CONCAT44(extraout_var_00,iVar26); plVar20 != plVar6;
                    plVar20 = plVar20 + 2) {
                  lVar7 = *plVar20;
                  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar20[1];
                  if (p_Var8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    *(undefined1 *)(lVar7 + 0xe0) = 0;
                  }
                  else {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
                    }
                    *(undefined1 *)(lVar7 + 0xe0) = 0;
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
                  }
                }
                std::
                vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
                resize(&this->m_partHighlighted,0);
                std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::resize
                          (&this->m_pinHighlighted,0);
                peVar24 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr;
              }
              ((peVar24->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->visualmode = '\x01';
              std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ::push_back(&this->m_partHighlighted,&peVar24->component);
              if ((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  == (element_type *)0x0) goto LAB_00118cb8;
            }
LAB_00118f20:
            if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
            }
          }
          else if (this->m_showContextMenu == false) {
            iVar26 = AnnotationIsHovered(this);
            if (iVar26 == 0) {
              this->AnnotationWasHovered = false;
              this->m_needsRedraw = true;
            }
            else {
              this->m_needsRedraw = true;
              this->AnnotationWasHovered = true;
            }
          }
        }
        else {
          bVar14 = ImGui::IsMouseClicked(1,false);
          if (!bVar14) {
            bVar21 = this->m_lastFileOpenWasInvalid;
            pBVar19 = this->m_file;
            pBVar16 = this->m_board;
            goto LAB_001189f3;
          }
          if ((this->config).showAnnotations == true) {
            IVar11 = ImGui::GetMousePos();
            uStack_70 = extraout_XMM0_Dc_00;
            local_78._0_4_ = IVar11.x;
            local_78._4_4_ = IVar11.y;
            uStack_6c = extraout_XMM0_Dd_00;
            this_01 = this;
            iVar26 = AnnotationIsHovered(this);
            auVar12 = _local_78;
            if (iVar26 != 0) {
              this->m_annotation_clicked_id = this->m_annotation_last_hovered;
            }
            this->m_annotationedit_retain = false;
            this->m_showContextMenu = true;
            (this->m_showContextMenuPos).x = (float)local_78._0_4_;
            (this->m_showContextMenuPos).y = (float)local_78._4_4_;
            this->m_needsRedraw = true;
            _local_78 = auVar12;
            if (this->debug == true) {
              HandleInput(this_01);
            }
          }
        }
LAB_00118f2f:
        this->m_draggingLastFrame = false;
      }
      fVar29 = pIVar15->MouseWheel;
      if ((fVar29 != 0.0) || (NAN(fVar29))) {
        Zoom(this,(pIVar15->MousePos).x,(pIVar15->MousePos).y,fVar29 * (this->config).zoomFactor);
      }
    }
  }
LAB_00118f6b:
  if (pIVar15->WantCaptureKeyboard != false) {
    return;
  }
  _local_b8 = (ImVec2)&local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Mirror","");
  this_00 = &this->keybindings;
  bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
  if (_local_b8 != (ImVec2)&local_a8) {
    operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
  }
  if (bVar14) {
    Mirror(this);
    CenterView(this);
LAB_00118fd7:
    this->m_needsRedraw = true;
  }
  else {
    _local_b8 = (ImVec2)&local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"RotateCW","");
    bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
    if (_local_b8 != (ImVec2)&local_a8) {
      operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
    }
    if (bVar14) {
      iVar26 = 1;
    }
    else {
      _local_b8 = (ImVec2)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"RotateCCW","");
      bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
      if (_local_b8 != (ImVec2)&local_a8) {
        operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
      }
      if (!bVar14) {
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"ZoomIn","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          fVar28 = (this->m_board_surface).x;
          fVar2 = (this->m_board_surface).y;
          fVar29 = (this->config).zoomFactor;
LAB_00119161:
          Zoom(this,fVar28 * 0.5,fVar2 * 0.5,fVar29);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"ZoomOut","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          fVar28 = (this->m_board_surface).x;
          fVar2 = (this->m_board_surface).y;
          fVar29 = -(this->config).zoomFactor;
          goto LAB_00119161;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PanDown","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          iVar26 = DPI((this->config).panFactor);
          iVar27 = 2;
LAB_001192ca:
          Pan(this,iVar27,iVar26);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PanUp","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          iVar26 = DPI((this->config).panFactor);
          iVar27 = 1;
          goto LAB_001192ca;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PanLeft","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          iVar26 = DPI((this->config).panFactor);
          iVar27 = 3;
          goto LAB_001192ca;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PanRight","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          iVar26 = DPI((this->config).panFactor);
          iVar27 = 4;
          goto LAB_001192ca;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Center","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          CenterView(this);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Quit","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          this->m_wantsQuit = true;
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"InfoPanel","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          bVar14 = (bool)((this->config).showInfoPanel ^ 1);
          (this->config).showInfoPanel = bVar14;
          Confparse::WriteBool(&this->obvconfig,"showInfoPanel",bVar14);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"NetList","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          this->m_showNetList = (bool)(this->m_showNetList ^ 1);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"PartList","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          this->m_showPartList = (bool)(this->m_showPartList ^ 1);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Flip","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (bVar14) {
          FlipBoard(this,0);
          return;
        }
        _local_b8 = (ImVec2)&local_a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"TogglePins","");
        bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
        if (_local_b8 != (ImVec2)&local_a8) {
          operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
        }
        if (!bVar14) {
          _local_b8 = (ImVec2)&local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Search","");
          bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
          if (_local_b8 != (ImVec2)&local_a8) {
            operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
          }
          if (bVar14) {
            if (this->m_validBoard != true) {
              return;
            }
            this->m_showSearch = true;
            this->m_needsRedraw = true;
            return;
          }
          _local_b8 = (ImVec2)&local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"Clear","");
          bVar14 = KeyBindings::isPressed(this_00,(string *)local_b8);
          if (_local_b8 != (ImVec2)&local_a8) {
            operator_delete((void *)_local_b8,local_a8._M_allocated_capacity + 1);
          }
          if (!bVar14) {
            return;
          }
          ClearAllHighlights(this);
          return;
        }
        pbVar1 = &(this->config).showPins;
        *pbVar1 = (bool)(*pbVar1 ^ 1);
        goto LAB_00118fd7;
      }
      iVar26 = -1;
    }
    Rotate(this,iVar26);
  }
  return;
}

Assistant:

void BoardView::HandleInput() {
	if (!m_board || (!m_file)) return;

	const ImGuiIO &io = ImGui::GetIO();

	if (ImGui::IsWindowHovered()) {
		if (!ImGui::IsWindowFocused()) {
			// Set focus on boardview area hover to apply our key bindings instead of the currently active ImGui's keyboard navigation
			// Using imgui_internal's FocusWindow with UnlessBelowModal instead of SetWindowFocus
			// Otherwise PopupModal get closed right after opening when boardview area is hovered
			// https://github.com/ocornut/imgui/issues/3595
			// Warning: wouldn't work with regular Popup but we use only PopupModal
			ImGui::FocusWindow(nullptr, ImGuiFocusRequestFlags_UnlessBelowModal);
		}

		if (ImGui::IsMouseDragging(0)) {
			if ((m_dragging_token == 0) && (io.MouseClickedPos[0].x < m_board_surface.x)) m_dragging_token = 1; // own it.
			if (m_dragging_token == 1) {
				//		   if ((io.MouseClickedPos[0].x < m_info_surface.x)) {
				ImVec2 delta = ImGui::GetMouseDragDelta();
				if ((abs(delta.x) > 500) || (abs(delta.y) > 500)) {
					delta.x = 0;
					delta.y = 0;
				} // If the delta values are crazy just drop them (happens when panning
				// off screen). 500 arbritary chosen
				ImGui::ResetMouseDragDelta();
				ImVec2 td = ScreenToCoord(delta.x, delta.y, 0);
				m_dx += td.x;
				m_dy += td.y;
				m_draggingLastFrame = true;
				m_needsRedraw       = true;
			}
		} else if (m_dragging_token >= 0) {
			m_dragging_token = 0;

			if (m_lastFileOpenWasInvalid == false) {
				// Conext menu
				if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseClicked(1)) {
					if (config.showAnnotations) {
						// Build context menu here, for annotations and inspection
						//
						ImVec2 spos = ImGui::GetMousePos();
						if (AnnotationIsHovered()) m_annotation_clicked_id = m_annotation_last_hovered;

						m_annotationedit_retain = false;
						m_showContextMenu       = true;
						m_showContextMenuPos    = spos;
						m_needsRedraw           = true;
						if (debug) fprintf(stderr, "context click request at (%f %f)\n", spos.x, spos.y);
					}

					// Flip the board with the middle click
				} else if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseReleased(2)) {
					FlipBoard();

					// Else, click to select pin
				} else if (!m_lastFileOpenWasInvalid && m_file && m_board && ImGui::IsMouseReleased(0) && !m_draggingLastFrame) {
					ImVec2 spos = ImGui::GetMousePos();
					ImVec2 pos  = ScreenToCoord(spos.x, spos.y);

					m_needsRedraw = true;

					// threshold to within a pin's diameter of the pin center
					// float min_dist = m_pinDiameter * 1.0f;
					float min_dist = m_pinDiameter / 2.0f;
					min_dist *= min_dist; // all distance squared
					std::shared_ptr<Pin> selection = nullptr;
					for (auto &pin : m_board->Pins()) {
						if (BoardElementIsVisible(pin)) {
							float dx   = pin->position.x - pos.x;
							float dy   = pin->position.y - pos.y;
							float dist = dx * dx + dy * dy;
							if ((dist < (pin->diameter * pin->diameter)) && (dist < min_dist)) {
								selection = pin;
								min_dist  = dist;
							}
						}
					}

					m_pinSelected = selection;
					if (m_pinSelected) {
						if (!io.KeyCtrl) {
							for (auto p : m_board->Components()) {
								p->visualmode = p->CVMNormal;
							}
							m_partHighlighted.resize(0);
							m_pinHighlighted.resize(0);
						}
						m_pinSelected->component->visualmode = m_pinSelected->component->CVMSelected;
						m_partHighlighted.push_back(m_pinSelected->component);
					}

					if (m_pinSelected == nullptr) {
						bool any_hits = false;

						for (auto &part : m_board->Components()) {
							int hit = 0;
							//							auto p_part = part.get();

							if (!BoardElementIsVisible(part)) continue;

							// Work out if the point is inside the hull
							{
								auto poly = part->outline;

								for (size_t i = 0, j = poly.size() - 1; i < poly.size(); j = i++) {
									if (((poly[i].y > pos.y) != (poly[j].y > pos.y)) &&
									    (pos.x <
									     (poly[j].x - poly[i].x) * (pos.y - poly[i].y) / (poly[j].y - poly[i].y) + poly[i].x))
										hit ^= 1;
								}
							}

							if (hit) {
								any_hits = true;

								bool partInList = contains(part, m_partHighlighted);

								/*
								 * If the CTRL key isn't held down, then we have to
								 * flush any existing highlighted parts
								 */
								if (io.KeyCtrl) {
									if (!partInList) {
										m_partHighlighted.push_back(part);
										part->visualmode = part->CVMSelected;
									} else {
										remove(part, m_partHighlighted);
										part->visualmode = part->CVMNormal;
									}

								} else {
									for (auto p : m_board->Components()) {
										p->visualmode = p->CVMNormal;
									}
									m_partHighlighted.resize(0);
									m_pinHighlighted.resize(0);
									if (!partInList) {
										m_partHighlighted.push_back(part);
										part->visualmode = part->CVMSelected;
									}
								}

								/*
								 * If this part has a non-selected visual mode (normal)
								 * AND it's not in the existing part list, then add it
								 */
								/*
								if (part->visualmode == part->CVMNormal) {
								    if (!partInList) {
								        m_partHighlighted.push_back(p_part);
								    }
								}

								part->visualmode++;
								part->visualmode %= part->CVMModeCount;

								if (part->visualmode == part->CVMNormal) {
								    remove(*part, m_partHighlighted);
								}
								*/
							} // if hit
						}     // for each part on the board

						/*
						 * If we aren't holding down CTRL and we click to a
						 * non pin, non part area, then we clear everything
						 */
						if ((!any_hits) && (!io.KeyCtrl)) {
							for (auto &part : m_board->Components()) {
								//								auto p        = part.get();
								part->visualmode = part->CVMNormal;
							}
							m_partHighlighted.clear();
						}

					} // if a pin wasn't selected

				} else {
					if (!m_showContextMenu) {
						if (AnnotationIsHovered()) {
							m_needsRedraw        = true;
							AnnotationWasHovered = true;
						} else {
							AnnotationWasHovered = false;
							m_needsRedraw        = true;
						}
					}
				}

				m_draggingLastFrame = false;
			}

			// Zoom:
			float mwheel = io.MouseWheel;
			if (mwheel != 0.0f) {
				mwheel *= config.zoomFactor;

				Zoom(io.MousePos.x, io.MousePos.y, mwheel);
			}
		}
	}

	if ((!io.WantCaptureKeyboard)) {

		if (keybindings.isPressed("Mirror")) {
			Mirror();
			CenterView();
			m_needsRedraw = true;

		} else if (keybindings.isPressed("RotateCW")) {
			// Rotate board: R and period rotate clockwise; comma rotates
			// counter-clockwise
			Rotate(1);

		} else if (keybindings.isPressed("RotateCCW")) {
			Rotate(-1);

		} else if (keybindings.isPressed("ZoomIn")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor);

		} else if (keybindings.isPressed("ZoomOut")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor);

		} else if (keybindings.isPressed("PanDown")) {
			Pan(DIR_DOWN, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanUp")) {
			Pan(DIR_UP, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanLeft")) {
			Pan(DIR_LEFT, DPI(config.panFactor));

		} else if (keybindings.isPressed("PanRight")) {
			Pan(DIR_RIGHT, DPI(config.panFactor));

		} else if (keybindings.isPressed("Center")) {
			// Center and reset zoom
			CenterView();

		} else if (keybindings.isPressed("Quit")) {
			// quit OFBV
			m_wantsQuit = true;

		} else if (keybindings.isPressed("InfoPanel")) {
			config.showInfoPanel = !config.showInfoPanel;
			obvconfig.WriteBool("showInfoPanel", config.showInfoPanel ? true : false);

		} else if (keybindings.isPressed("NetList")) {
			// Show Net List
			m_showNetList = m_showNetList ? false : true;

		} else if (keybindings.isPressed("PartList")) {
			// Show Part List
			m_showPartList = m_showPartList ? false : true;

		} else if (keybindings.isPressed("Flip")) {
			// Flip board:
			FlipBoard();

		} else if (keybindings.isPressed("TogglePins")) {
			config.showPins ^= 1;
			m_needsRedraw = true;

		} else if (keybindings.isPressed("Search")) {
			if (m_validBoard) {
				m_showSearch  = true;
				m_needsRedraw = true;
			}

		} else if (keybindings.isPressed("Clear")) {
			ClearAllHighlights();

		} else {
			/*
			 * Do what ever is required for unhandled key presses.
			 */
		}
	}
}